

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesBoolWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesBoolWidget::HandleInput
          (cmCursesBoolWidget *this,int *key,cmCursesMainForm *param_2,WINDOW *w)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  
  iVar1 = *key;
  if (((iVar1 == 10) || (iVar1 == 0x157)) || (iVar1 == 0x20)) {
    bVar2 = GetValueAsBool(this);
    SetValueAsBool(this,!bVar2);
    if (w == (WINDOW *)0x0) {
      uVar3 = 0xffffffffffffffff;
    }
    else {
      uVar3 = (ulong)((int)w->_maxy + 1);
    }
    wtouchln(w,0,uVar3,1);
    wrefresh(w);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool cmCursesBoolWidget::HandleInput(int& key, cmCursesMainForm* /*fm*/,
                                     WINDOW* w)
{

  // toggle boolean values with enter or space
  // 10 == enter
  if (key == 10 || key == KEY_ENTER || key == ' ') {
    if (this->GetValueAsBool()) {
      this->SetValueAsBool(false);
    } else {
      this->SetValueAsBool(true);
    }

    touchwin(w);
    wrefresh(w);
    return true;
  }
  return false;
}